

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O0

int ffgcx(fitsfile *fptr,int colnum,LONGLONG frow,LONGLONG fbit,LONGLONG nbit,char *larray,
         int *status)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long *heapaddr;
  fitsfile *in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  int *in_stack_00000008;
  tcolumn *colptr;
  uchar cbuff;
  int descrp;
  int tcode;
  LONGLONG estart;
  LONGLONG rstart;
  long fbyte;
  long bitloc;
  long repeat;
  long ii;
  long ndone;
  long offset;
  LONGLONG bstart;
  int *status_00;
  undefined7 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  int iVar5;
  uint uVar6;
  int *local_68;
  int *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  long nbytes;
  fitsfile *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int local_4;
  
  if (*in_stack_00000008 < 1) {
    if (in_R8 < 1) {
      local_4 = *in_stack_00000008;
    }
    else if (in_RDX < 1) {
      *in_stack_00000008 = 0x133;
      local_4 = 0x133;
    }
    else if ((long)in_RCX < 1) {
      *in_stack_00000008 = 0x134;
      local_4 = 0x134;
    }
    else {
      if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
           (iVar5 = ffrdef((fitsfile *)bstart,(int *)offset), 0 < iVar5)) {
          return *in_stack_00000008;
        }
      }
      else {
        ffmahd(in_RCX,(int)((ulong)in_R8 >> 0x20),in_R9,in_stack_ffffffffffffffc0);
      }
      lVar3 = (long)&in_RCX->field_0x7 / 8;
      status_00 = (int *)((long)&in_RCX[-1].Fptr + 7);
      local_68 = status_00 + ((long)((long)&in_RCX[-1].Fptr + 7) / 8) * -2;
      nbytes = 0;
      piVar4 = (int *)(lVar3 + -1);
      heapaddr = (long *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0);
      uVar6 = *(uint *)(heapaddr + 10);
      uVar1 = uVar6;
      if ((int)uVar6 < 1) {
        uVar1 = -uVar6;
      }
      if ((int)uVar1 < 0xc) {
        if ((int)uVar6 < 1) {
          iVar5 = 1;
          ffgdes((fitsfile *)(in_RDX + -1),(int)((ulong)piVar4 >> 0x20),CONCAT44(uVar6,1),
                 (long *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),heapaddr,
                 status_00);
          if (uVar6 == 0xffffffff) {
            in_stack_ffffffffffffffa0 = (int *)(((long)in_stack_ffffffffffffffa0 + 7) / 8);
          }
          if ((long)in_stack_ffffffffffffffa0 < (long)(&in_RCX->field_0x6 + in_R8) / 8) {
            *in_stack_00000008 = 0x134;
            return 0x134;
          }
        }
        else {
          iVar5 = 0;
          in_stack_ffffffffffffffa0 = (int *)heapaddr[0xb];
          if (uVar6 == 1) {
            in_stack_ffffffffffffffa0 = (int *)(((long)in_stack_ffffffffffffffa0 + 7) / 8);
          }
          if ((long)in_stack_ffffffffffffffa0 < lVar3) {
            *in_stack_00000008 = 0x134;
            return 0x134;
          }
        }
        iVar2 = ffmbyt((fitsfile *)CONCAT44(uVar6,iVar5),
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (int)((ulong)heapaddr >> 0x20),status_00);
        if (iVar2 < 1) {
          while (iVar2 = ffgbyt(in_stack_ffffffffffffffb8,nbytes,in_stack_ffffffffffffffa8,
                                in_stack_ffffffffffffffa0), in_stack_ffffffffffffffa8 = local_68,
                iVar2 < 1) {
            for (; (long)in_stack_ffffffffffffffa8 < 8 && nbytes < in_R8;
                in_stack_ffffffffffffffa8 = (int *)((long)in_stack_ffffffffffffffa8 + 1)) {
              if ((in_stack_ffffffffffffff77 & *(byte *)(in_stack_ffffffffffffffa8 + 0xa28c5)) == 0)
              {
                *(undefined1 *)((long)in_R9 + nbytes) = 0;
              }
              else {
                *(undefined1 *)((long)in_R9 + nbytes) = 1;
              }
              nbytes = nbytes + 1;
            }
            if (nbytes == in_R8) {
              return *in_stack_00000008;
            }
            if ((iVar5 == 0) &&
               (piVar4 = (int *)((long)piVar4 + 1), piVar4 == in_stack_ffffffffffffffa0)) {
              piVar4 = (int *)0x0;
              ffmbyt((fitsfile *)((ulong)uVar6 << 0x20),
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                     (int)((ulong)heapaddr >> 0x20),status_00);
            }
            local_68 = (int *)0x0;
          }
          local_4 = *in_stack_00000008;
        }
        else {
          local_4 = *in_stack_00000008;
        }
      }
      else {
        *in_stack_00000008 = 0x136;
        local_4 = 0x136;
      }
    }
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int ffgcx(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int   colnum,    /* I - number of column to write (1 = 1st col) */
            LONGLONG  frow,      /* I - first row to write (1 = 1st row)        */
            LONGLONG  fbit,      /* I - first bit to write (1 = 1st)            */
            LONGLONG  nbit,      /* I - number of bits to write                 */
            char *larray,    /* O - array of logicals corresponding to bits */
            int  *status)    /* IO - error status                           */
/*
  read an array of logical values from a specified bit or byte
  column of the binary table.    larray is set = TRUE, if the corresponding
  bit = 1, otherwise it is set to FALSE.
  The binary table column being read from must have datatype 'B' or 'X'. 
*/
{
    LONGLONG bstart;
    long offset, ndone, ii, repeat, bitloc, fbyte;
    LONGLONG  rstart, estart;
    int tcode, descrp;
    unsigned char cbuff;
    static unsigned char onbit[8] = {128,  64,  32,  16,   8,   4,   2,   1};
    tcolumn *colptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*  check input parameters */
    if (nbit < 1)
        return(*status);
    else if (frow < 1)
        return(*status = BAD_ROW_NUM);
    else if (fbit < 1)
        return(*status = BAD_ELEM_NUM);

    /* position to the correct HDU */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    fbyte = (long) ((fbit + 7) / 8);
    bitloc = (long) (fbit - 1 - ((fbit - 1) / 8 * 8));
    ndone = 0;
    rstart = frow - 1;
    estart = fbyte - 1;

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode = colptr->tdatatype;

    if (abs(tcode) > TBYTE)
        return(*status = NOT_LOGICAL_COL); /* not correct datatype column */

    if (tcode > 0)
    {
        descrp = FALSE;  /* not a variable length descriptor column */
        /* N.B: REPEAT is the number of bytes, not number of bits */
        repeat = (long) colptr->trepeat;

        if (tcode == TBIT)
            repeat = (repeat + 7) / 8;  /* convert from bits to bytes */

        if (fbyte > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol + estart;
    }
    else
    {
        descrp = TRUE;  /* a variable length descriptor column */
        /* only bit arrays (tform = 'X') are supported for variable */
        /* length arrays.  REPEAT is the number of BITS in the array. */

        ffgdes(fptr, colnum, frow, &repeat, &offset, status);

        if (tcode == -TBIT)
            repeat = (repeat + 7) / 8;

        if ((fbit + nbit + 6) / 8 > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + offset + (fptr->Fptr)->heapstart + estart;
    }

    /* move the i/o pointer to the start of the pixel sequence */
    if (ffmbyt(fptr, bstart, REPORT_EOF, status) > 0)
        return(*status);

    /* read the next byte */
    while (1)
    {
      if (ffgbyt(fptr, 1, &cbuff, status) > 0)
        return(*status);

      for (ii = bitloc; (ii < 8) && (ndone < nbit); ii++, ndone++)
      {
        if(cbuff & onbit[ii])       /* test if bit is set */
          larray[ndone] = TRUE;
        else
          larray[ndone] = FALSE;
      }

      if (ndone == nbit)   /* finished all the bits */
        return(*status);

      /* not done, so get the next byte */
      if (!descrp)
      {
        estart++;
        if (estart == repeat) 
        {
          /* move the i/o pointer to the next row of pixels */
          estart = 0;
          rstart = rstart + 1;
          bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol;

          ffmbyt(fptr, bstart, REPORT_EOF, status);
        }
      }
      bitloc = 0;
    }
}